

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aecm_core_c.cc
# Opt level: O1

int TimeToFrequencyDomain
              (AecmCore *aecm,int16_t *time_signal,ComplexInt16 *freq_signal,
              uint16_t *freq_signal_abs,uint32_t *freq_signal_sum_abs)

{
  uint uVar1;
  ushort uVar2;
  int32_t iVar3;
  short *psVar4;
  ushort uVar5;
  uint uVar6;
  ushort uVar7;
  long lVar8;
  uint uVar9;
  int16_t fft_buf [272];
  int16_t local_240 [64];
  undefined2 auStack_1c0 [200];
  
  uVar2 = (*WebRtcSpl_MaxAbsValueW16)(time_signal,0x80);
  if (uVar2 == 0) {
    uVar6 = 0;
  }
  else {
    uVar9 = ((int)(short)uVar2 >> 0xf ^ (uint)uVar2) & 0xffff;
    uVar6 = (uint)(uVar9 < 0x80) * 8;
    uVar1 = (uint)(uVar9 < 0x80) * 8 + 4;
    if ((uVar9 << (sbyte)uVar6 & 0xf800) != 0) {
      uVar1 = uVar6;
    }
    uVar6 = uVar1 + 2;
    if ((uVar9 << (sbyte)uVar1 & 0xe000) != 0) {
      uVar6 = uVar1;
    }
    uVar6 = (uVar9 << ((byte)uVar6 & 0x1f) & 0xc000) == 0 | uVar6;
  }
  psVar4 = WebRtcAecm_kSqrtHanning + 0x40;
  lVar8 = 0;
  do {
    *(short *)((long)local_240 + lVar8) =
         (short)((uint)((int)*(short *)((long)WebRtcAecm_kSqrtHanning + lVar8) *
                       (int)(short)(*(short *)((long)time_signal + lVar8) << ((byte)uVar6 & 0x1f)))
                >> 0xe);
    *(short *)((long)auStack_1c0 + lVar8) =
         (short)((uint)((int)*psVar4 *
                       (int)(short)(*(short *)((long)time_signal + lVar8 + 0x80) <<
                                   ((byte)uVar6 & 0x1f))) >> 0xe);
    lVar8 = lVar8 + 2;
    psVar4 = psVar4 + -1;
  } while (lVar8 != 0x80);
  WebRtcSpl_RealForwardFFT(aecm->real_fft,local_240,&freq_signal->real);
  lVar8 = 2;
  do {
    psVar4 = (short *)((long)&freq_signal->real + lVar8);
    *psVar4 = -*psVar4;
    lVar8 = lVar8 + 4;
  } while (lVar8 != 0x102);
  lVar8 = 0;
  freq_signal->imag = 0;
  freq_signal[0x40].imag = 0;
  uVar2 = freq_signal->real;
  uVar5 = -uVar2;
  if (0 < (short)uVar2) {
    uVar5 = uVar2;
  }
  *freq_signal_abs = uVar5;
  uVar2 = freq_signal[0x40].real;
  uVar7 = -uVar2;
  if (0 < (short)uVar2) {
    uVar7 = uVar2;
  }
  freq_signal_abs[0x40] = uVar7;
  *freq_signal_sum_abs = (uint)uVar7 + (uint)uVar5;
  do {
    uVar2 = freq_signal[lVar8 + 1].real;
    uVar5 = freq_signal[lVar8 + 1].imag;
    if (uVar2 == 0) {
      uVar7 = -uVar5;
      if (0 < (short)uVar5) {
        uVar7 = uVar5;
      }
    }
    else {
      uVar7 = -uVar2;
      if (0 < (short)uVar2) {
        uVar7 = uVar2;
      }
      if (uVar5 != 0) {
        uVar2 = -uVar5;
        if (0 < (short)uVar5) {
          uVar2 = uVar5;
        }
        iVar3 = WebRtcSpl_SqrtFloor((int)(short)uVar2 * (int)(short)uVar2 +
                                    (int)(short)uVar7 * (int)(short)uVar7);
        uVar7 = (ushort)iVar3;
      }
    }
    freq_signal_abs[lVar8 + 1] = uVar7;
    *freq_signal_sum_abs = *freq_signal_sum_abs + (uint)uVar7;
    lVar8 = lVar8 + 1;
  } while (lVar8 != 0x3f);
  return uVar6;
}

Assistant:

static int TimeToFrequencyDomain(AecmCore* aecm,
                                 const int16_t* time_signal,
                                 ComplexInt16* freq_signal,
                                 uint16_t* freq_signal_abs,
                                 uint32_t* freq_signal_sum_abs) {
  int i = 0;
  int time_signal_scaling = 0;

  int32_t tmp32no1 = 0;
  int32_t tmp32no2 = 0;

  // In fft_buf, +16 for 32-byte alignment.
  int16_t fft_buf[PART_LEN4 + 16];
  int16_t *fft = (int16_t *) (((uintptr_t) fft_buf + 31) & ~31);

  int16_t tmp16no1;
#ifndef WEBRTC_ARCH_ARM_V7
  int16_t tmp16no2;
#endif
#ifdef AECM_WITH_ABS_APPROX
  int16_t max_value = 0;
  int16_t min_value = 0;
  uint16_t alpha = 0;
  uint16_t beta = 0;
#endif

#ifdef AECM_DYNAMIC_Q
  tmp16no1 = WebRtcSpl_MaxAbsValueW16(time_signal, PART_LEN2);
  time_signal_scaling = WebRtcSpl_NormW16(tmp16no1);
#endif

  WindowAndFFT(aecm, fft, time_signal, freq_signal, time_signal_scaling);

  // Extract imaginary and real part, calculate the magnitude for
  // all frequency bins
  freq_signal[0].imag = 0;
  freq_signal[PART_LEN].imag = 0;
  freq_signal_abs[0] = (uint16_t)WEBRTC_SPL_ABS_W16(freq_signal[0].real);
  freq_signal_abs[PART_LEN] = (uint16_t)WEBRTC_SPL_ABS_W16(
                                freq_signal[PART_LEN].real);
  (*freq_signal_sum_abs) = (uint32_t)(freq_signal_abs[0]) +
                           (uint32_t)(freq_signal_abs[PART_LEN]);

  for (i = 1; i < PART_LEN; i++)
  {
    if (freq_signal[i].real == 0)
    {
      freq_signal_abs[i] = (uint16_t)WEBRTC_SPL_ABS_W16(freq_signal[i].imag);
    }
    else if (freq_signal[i].imag == 0)
    {
      freq_signal_abs[i] = (uint16_t)WEBRTC_SPL_ABS_W16(freq_signal[i].real);
    }
    else
    {
      // Approximation for magnitude of complex fft output
      // magn = sqrt(real^2 + imag^2)
      // magn ~= alpha * max(|imag|,|real|) + beta * min(|imag|,|real|)
      //
      // The parameters alpha and beta are stored in Q15

#ifdef AECM_WITH_ABS_APPROX
      tmp16no1 = WEBRTC_SPL_ABS_W16(freq_signal[i].real);
      tmp16no2 = WEBRTC_SPL_ABS_W16(freq_signal[i].imag);

      if(tmp16no1 > tmp16no2)
      {
        max_value = tmp16no1;
        min_value = tmp16no2;
      } else
      {
        max_value = tmp16no2;
        min_value = tmp16no1;
      }

      // Magnitude in Q(-6)
      if ((max_value >> 2) > min_value)
      {
        alpha = kAlpha1;
        beta = kBeta1;
      } else if ((max_value >> 1) > min_value)
      {
        alpha = kAlpha2;
        beta = kBeta2;
      } else
      {
        alpha = kAlpha3;
        beta = kBeta3;
      }
      tmp16no1 = (int16_t)((max_value * alpha) >> 15);
      tmp16no2 = (int16_t)((min_value * beta) >> 15);
      freq_signal_abs[i] = (uint16_t)tmp16no1 + (uint16_t)tmp16no2;
#else
#ifdef WEBRTC_ARCH_ARM_V7
      __asm __volatile(
        "smulbb %[tmp32no1], %[real], %[real]\n\t"
        "smlabb %[tmp32no2], %[imag], %[imag], %[tmp32no1]\n\t"
        :[tmp32no1]"+&r"(tmp32no1),
         [tmp32no2]"=r"(tmp32no2)
        :[real]"r"(freq_signal[i].real),
         [imag]"r"(freq_signal[i].imag)
      );
#else
      tmp16no1 = WEBRTC_SPL_ABS_W16(freq_signal[i].real);
      tmp16no2 = WEBRTC_SPL_ABS_W16(freq_signal[i].imag);
      tmp32no1 = tmp16no1 * tmp16no1;
      tmp32no2 = tmp16no2 * tmp16no2;
      tmp32no2 = WebRtcSpl_AddSatW32(tmp32no1, tmp32no2);
#endif // WEBRTC_ARCH_ARM_V7
      tmp32no1 = WebRtcSpl_SqrtFloor(tmp32no2);

      freq_signal_abs[i] = (uint16_t)tmp32no1;
#endif // AECM_WITH_ABS_APPROX
    }
    (*freq_signal_sum_abs) += (uint32_t)freq_signal_abs[i];
  }

  return time_signal_scaling;
}